

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

AstNode * parse_yindex(ParserState *parser)

{
  LexerState *ls;
  AstNode *pAVar1;
  AstNode *pAVar2;
  
  ls = parser->ls;
  raviX_next(ls);
  pAVar1 = parse_expression(parser);
  checknext(ls,0x5d);
  pAVar2 = allocate_expr_ast_node(parser,EXPR_Y_INDEX);
  (pAVar2->field_2).function_stmt.function_expr = pAVar1;
  (pAVar2->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar2->field_2).goto_stmt.name = (StringObject *)0x0;
  return pAVar2;
}

Assistant:

static AstNode *parse_yindex(ParserState *parser)
{
	LexerState *ls = parser->ls;
	/* index -> '[' expr ']' */
	raviX_next(ls); /* skip the '[' */
	AstNode *expr = parse_expression(parser);
	checknext(ls, ']');

	AstNode *index = allocate_expr_ast_node(parser, EXPR_Y_INDEX);
	index->index_expr.expr = expr;
	set_type(&index->index_expr.type, RAVI_TANY);
	return index;
}